

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

void * mpp_enc_async_thread(void *data)

{
  MppEncImpl *enc_00;
  MppThread *this;
  mpp_list *this_00;
  MppThreadStatus MVar1;
  RK_S32 RVar2;
  MPP_RET MVar3;
  Mutex *pMVar4;
  undefined1 local_70 [8];
  AutoMutex autolock_1;
  AutoMutex autolock_2;
  mpp_list *frm_in;
  undefined1 local_40 [8];
  AutoMutex autolock;
  MPP_RET ret;
  EncAsyncWait wait;
  MppThread *thd_enc;
  MppEncImpl *enc;
  Mpp *mpp;
  void *data_local;
  
  enc_00 = *(MppEncImpl **)((long)data + 0xb0);
  this = enc_00->thread_enc;
  autolock.mLock._0_4_ = MPP_OK;
  if ((mpp_enc_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_enc","thread start\n","mpp_enc_async_thread");
  }
  autolock.mLock._4_4_ = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        pMVar4 = MppThread::mutex(this,THREAD_WORK);
        Mutex::Autolock::Autolock((Autolock *)local_40,pMVar4,1);
        MVar1 = MppThread::get_status(this,THREAD_WORK);
        if (MVar1 == MPP_THREAD_RUNNING) {
          MVar3 = check_enc_async_wait(enc_00,(EncAsyncWait *)((long)&autolock.mLock + 4));
          if (MVar3 != MPP_OK) {
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","wait start\n","mpp_enc_async_thread");
            }
            MppThread::wait(this,(void *)0x0);
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","wait done\n","mpp_enc_async_thread");
            }
          }
          frm_in._4_4_ = 0;
        }
        else {
          frm_in._4_4_ = 5;
        }
        Mutex::Autolock::~Autolock((Autolock *)local_40);
        if (frm_in._4_4_ != 0) {
          do {
            MVar3 = try_proc_processing_task(enc_00,(EncAsyncWait *)((long)&autolock.mLock + 4));
          } while (MVar3 == MPP_OK);
          if ((mpp_enc_debug & 1) != 0) {
            _mpp_log_l(4,"mpp_enc","thread finish\n","mpp_enc_async_thread");
          }
          return (void *)0x0;
        }
        if ((enc_00->cmd_send == enc_00->cmd_recv) && (enc_00->reset_flag == 0)) break;
        this_00 = *(mpp_list **)((long)data + 0x10);
        MppMutexCond::lock(&this_00->super_MppMutexCond);
        if ((mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","ctrl proc %d cmd %08x\n","mpp_enc_async_thread",
                     (ulong)enc_00->cmd_recv,(ulong)enc_00->cmd);
        }
        do {
          MVar3 = try_proc_processing_task(enc_00,(EncAsyncWait *)((long)&autolock.mLock + 4));
        } while (MVar3 == MPP_OK);
        if (enc_00->cmd_send == enc_00->cmd_recv) {
          if (enc_00->reset_flag != 0) {
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","thread reset start\n","mpp_enc_async_thread");
            }
            while (RVar2 = mpp_list::list_size(this_00), RVar2 != 0) {
              async_task_skip(enc_00);
            }
            pMVar4 = MppThread::mutex(this,THREAD_WORK);
            Mutex::Autolock::Autolock((Autolock *)&autolock_1.mLock,pMVar4,1);
            enc_00->status_flag = 0;
            Mutex::Autolock::~Autolock((Autolock *)&autolock_1.mLock);
            (enc_00->frm_cfg).force_flag = (enc_00->frm_cfg).force_flag | 1;
            (enc_00->frm_cfg).force_idr = (enc_00->frm_cfg).force_idr + 1;
            pMVar4 = MppThread::mutex(this,THREAD_CONTROL);
            Mutex::Autolock::Autolock((Autolock *)local_70,pMVar4,1);
            enc_00->reset_flag = 0;
            sem_post((sem_t *)&enc_00->enc_reset);
            if ((mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","thread reset done\n","mpp_enc_async_thread");
            }
            Mutex::Autolock::~Autolock((Autolock *)local_70);
          }
        }
        else {
          sem_wait((sem_t *)&enc_00->cmd_start);
          autolock.mLock._0_4_ = mpp_enc_proc_cfg(enc_00,enc_00->cmd,enc_00->param);
          if ((MPP_RET)autolock.mLock != MPP_OK) {
            *enc_00->cmd_ret = (MPP_RET)autolock.mLock;
          }
          enc_00->cmd_recv = enc_00->cmd_recv + 1;
          if ((mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","ctrl proc %d done send %d\n","mpp_enc_async_thread",
                       (ulong)enc_00->cmd_recv,(ulong)enc_00->cmd_send);
          }
          if ((enc_00->cmd_send != enc_00->cmd_send) &&
             (_mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,
                         "enc->cmd_send == enc->cmd_send","mpp_enc_async_thread",0xd3f),
             (mpp_debug & 0x10000000) != 0)) {
            abort();
          }
          enc_00->param = (void *)0x0;
          enc_00->cmd = 0;
          sem_post((sem_t *)&enc_00->cmd_done);
          mpp_enc_hal_prepare(enc_00->enc_hal);
          mpp_enc_proc_rc_update(enc_00);
        }
        MppMutexCond::unlock(&this_00->super_MppMutexCond);
        autolock.mLock._4_4_ = 0;
      }
      autolock.mLock._0_4_ = try_get_async_task(enc_00,(EncAsyncWait *)((long)&autolock.mLock + 4));
      if ((mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","try_get_async_task ret %d\n","mpp_enc_async_thread",
                   (ulong)(uint)(MPP_RET)autolock.mLock);
      }
      if ((MPP_RET)autolock.mLock == MPP_OK) break;
      try_proc_processing_task(enc_00,(EncAsyncWait *)((long)&autolock.mLock + 4));
    }
    if ((enc_00->async == (EncAsyncTaskInfo *)0x0) &&
       (_mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->async",
                   "mpp_enc_async_thread",0xd6f), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (((enc_00->async->task).valid == 0) &&
       (_mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"enc->async->task.valid"
                   ,"mpp_enc_async_thread",0xd70), (mpp_debug & 0x10000000) != 0)) break;
    proc_async_task(enc_00,(EncAsyncWait *)((long)&autolock.mLock + 4));
  }
  abort();
}

Assistant:

void *mpp_enc_async_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    MppThread *thd_enc = enc->thread_enc;
    EncAsyncWait wait;
    MPP_RET ret = MPP_OK;

    enc_dbg_func("thread start\n");

    wait.val = 0;

    while (1) {
        {
            AutoMutex autolock(thd_enc->mutex());
            if (MPP_THREAD_RUNNING != thd_enc->get_status())
                break;

            if (check_enc_async_wait(enc, &wait)) {
                enc_dbg_detail("wait start\n");
                thd_enc->wait();
                enc_dbg_detail("wait done\n");
            }
        }

        // When encoder is not on encoding process external config and reset
        // 1. process user control and reset flag
        if (enc->cmd_send != enc->cmd_recv || enc->reset_flag) {
            mpp_list *frm_in = mpp->mFrmIn;

            /* when process cmd or reset hold frame input */
            frm_in->lock();

            enc_dbg_detail("ctrl proc %d cmd %08x\n", enc->cmd_recv, enc->cmd);

            // wait all tasks done
            while (MPP_OK == try_proc_processing_task(enc, &wait));

            if (enc->cmd_send != enc->cmd_recv) {
                sem_wait(&enc->cmd_start);
                ret = mpp_enc_proc_cfg(enc, enc->cmd, enc->param);
                if (ret)
                    *enc->cmd_ret = ret;
                enc->cmd_recv++;
                enc_dbg_detail("ctrl proc %d done send %d\n", enc->cmd_recv,
                               enc->cmd_send);
                mpp_assert(enc->cmd_send == enc->cmd_send);
                enc->param = NULL;
                enc->cmd = (MpiCmd)0;
                sem_post(&enc->cmd_done);

                // async cfg update process for hal
                // mainly for buffer prepare
                mpp_enc_hal_prepare(enc->enc_hal);

                /* NOTE: here will clear change flag of rc and prep cfg */
                mpp_enc_proc_rc_update(enc);
                goto SYNC_DONE;
            }

            if (enc->reset_flag) {
                enc_dbg_detail("thread reset start\n");

                /* skip the frames in input queue */
                while (frm_in->list_size())
                    async_task_skip(enc);

                {
                    AutoMutex autolock(thd_enc->mutex());
                    enc->status_flag = 0;
                }

                enc->frm_cfg.force_flag |= ENC_FORCE_IDR;
                enc->frm_cfg.force_idr++;

                AutoMutex autolock(thd_enc->mutex(THREAD_CONTROL));
                enc->reset_flag = 0;
                sem_post(&enc->enc_reset);
                enc_dbg_detail("thread reset done\n");
            }
        SYNC_DONE:
            frm_in->unlock();
            wait.val = 0;
            continue;
        }

        // 2. try get a task to encode
        ret = try_get_async_task(enc, &wait);
        enc_dbg_detail("try_get_async_task ret %d\n", ret);
        if (ret) {
            try_proc_processing_task(enc, &wait);
            continue;
        }

        mpp_assert(enc->async);
        mpp_assert(enc->async->task.valid);

        proc_async_task(enc, &wait);
    }
    /* wait all task done */
    while (MPP_OK == try_proc_processing_task(enc, &wait));

    enc_dbg_func("thread finish\n");

    return NULL;
}